

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

Attribute * __thiscall Assimp::CFIReaderImpl::getAttributeByName(CFIReaderImpl *this,char *name)

{
  pointer pAVar1;
  long lVar2;
  __type _Var3;
  Attribute *pAVar4;
  long lVar5;
  long lVar6;
  allocator local_51;
  string n;
  
  if (name == (char *)0x0) {
    pAVar4 = (Attribute *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&n,name,&local_51);
    lVar6 = -1;
    pAVar4 = (Attribute *)0x0;
    lVar2 = -0x90;
    do {
      lVar5 = lVar2;
      pAVar1 = (this->attributes).
               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 1;
      if ((int)(((long)(this->attributes).
                       super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x90) <= lVar6)
      goto LAB_0053aae4;
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pAVar1[1].name._M_dataplus._M_p + lVar5),&n);
      lVar2 = lVar5 + 0x90;
    } while (!_Var3);
    pAVar4 = (Attribute *)
             ((long)&(this->attributes).
                     super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].qname.prefix._M_dataplus + lVar5);
LAB_0053aae4:
    std::__cxx11::string::~string((string *)&n);
  }
  return pAVar4;
}

Assistant:

const Attribute* getAttributeByName(const char* name) const {
        if (!name) {
            return 0;
        }
        std::string n = name;
        for (int i=0; i<(int)attributes.size(); ++i) {
            if (attributes[i].name == n) {
                return &attributes[i];
            }
        }
        return 0;
    }